

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlObjAssignConst(Ssw_Sml_t *p,Aig_Obj_t *pObj,int fConst1,int iFrame)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  int local_2c;
  int i;
  uint *pSims;
  int iFrame_local;
  int fConst1_local;
  Aig_Obj_t *pObj_local;
  Ssw_Sml_t *p_local;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x234,"void Ssw_SmlObjAssignConst(Ssw_Sml_t *, Aig_Obj_t *, int, int)");
  }
  iVar1 = Aig_ObjIsCi(pObj);
  if (iVar1 != 0) {
    puVar2 = Ssw_ObjSim(p,pObj->Id);
    iVar1 = p->nWordsFrame;
    for (local_2c = 0; local_2c < p->nWordsFrame; local_2c = local_2c + 1) {
      uVar3 = 0;
      if (fConst1 != 0) {
        uVar3 = 0xffffffff;
      }
      puVar2[(long)(iVar1 * iFrame) + (long)local_2c] = uVar3;
    }
    return;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                ,0x235,"void Ssw_SmlObjAssignConst(Ssw_Sml_t *, Aig_Obj_t *, int, int)");
}

Assistant:

void Ssw_SmlObjAssignConst( Ssw_Sml_t * p, Aig_Obj_t * pObj, int fConst1, int iFrame )
{
    unsigned * pSims;
    int i;
    assert( iFrame < p->nFrames );
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = fConst1? ~(unsigned)0 : 0;
}